

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

CompilerHLSL * __thiscall
spirv_cross::CompilerHLSL::to_interpolation_qualifiers_abi_cxx11_(CompilerHLSL *this,Bitset *flags)

{
  bool bVar1;
  Bitset *in_RDX;
  Bitset *flags_local;
  CompilerHLSL *this_local;
  string *res;
  
  ::std::__cxx11::string::string((string *)this);
  bVar1 = Bitset::get(in_RDX,0xe);
  if ((bVar1) || (bVar1 = Bitset::get(in_RDX,0x14a5), bVar1)) {
    ::std::__cxx11::string::operator+=((string *)this,"nointerpolation ");
  }
  bVar1 = Bitset::get(in_RDX,0xd);
  if (bVar1) {
    ::std::__cxx11::string::operator+=((string *)this,"noperspective ");
  }
  bVar1 = Bitset::get(in_RDX,0x10);
  if (bVar1) {
    ::std::__cxx11::string::operator+=((string *)this,"centroid ");
  }
  bVar1 = Bitset::get(in_RDX,0xf);
  if (bVar1) {
    ::std::__cxx11::string::operator+=((string *)this,"patch ");
  }
  bVar1 = Bitset::get(in_RDX,0x11);
  if (bVar1) {
    ::std::__cxx11::string::operator+=((string *)this,"sample ");
  }
  bVar1 = Bitset::get(in_RDX,0x12);
  if ((bVar1) && (((ulong)flags[0x83].higher._M_h._M_single_bucket & 1) != 0)) {
    ::std::__cxx11::string::operator+=((string *)this,"precise ");
  }
  return this;
}

Assistant:

string CompilerHLSL::to_interpolation_qualifiers(const Bitset &flags)
{
	string res;
	//if (flags & (1ull << DecorationSmooth))
	//    res += "linear ";
	if (flags.get(DecorationFlat) || flags.get(DecorationPerVertexKHR))
		res += "nointerpolation ";
	if (flags.get(DecorationNoPerspective))
		res += "noperspective ";
	if (flags.get(DecorationCentroid))
		res += "centroid ";
	if (flags.get(DecorationPatch))
		res += "patch "; // Seems to be different in actual HLSL.
	if (flags.get(DecorationSample))
		res += "sample ";
	if (flags.get(DecorationInvariant) && backend.support_precise_qualifier)
		res += "precise "; // Not supported?

	return res;
}